

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O2

void __thiscall
yactfr::internal::PseudoDst::PseudoDst
          (PseudoDst *this,TypeId id,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ns,optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *name,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *uid,Up *pseudoPktCtxType,Up *pseudoErHeaderType,Up *pseudoErCommonCtxType,
          ClockType *defClkType,Up *attrs)

{
  _Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_> _Var1;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_38;
  
  _Var1.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (_Head_base<0UL,_const_yactfr::MapItem_*,_false>)
       (attrs->_M_t).
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  (attrs->_M_t).
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl = (MapItem *)0x0;
  (this->super_WithAttrsMixin)._attrs._M_t.
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false> =
       _Var1.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  local_38._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (_Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_38);
  this->_id = id;
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional_base(&(this->_ns).super_type,&ns->super_type);
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional_base(&(this->_name).super_type,&name->super_type);
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional_base(&(this->_uid).super_type,&uid->super_type);
  (this->_pseudoPktCtxType)._M_t.
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl =
       (pseudoPktCtxType->_M_t).
       super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
       ._M_t.
       super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
       .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  (pseudoPktCtxType->_M_t).
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl = (PseudoDt *)0x0;
  (this->_pseudoErHeaderType)._M_t.
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl =
       (pseudoErHeaderType->_M_t).
       super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
       ._M_t.
       super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
       .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  (pseudoErHeaderType->_M_t).
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl = (PseudoDt *)0x0;
  (this->_pseudoErCommonCtxType)._M_t.
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl =
       (pseudoErCommonCtxType->_M_t).
       super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
       ._M_t.
       super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
       .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  (pseudoErCommonCtxType->_M_t).
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl = (PseudoDt *)0x0;
  this->_defClkType = defClkType;
  return;
}

Assistant:

PseudoDst::PseudoDst(const TypeId id, boost::optional<std::string> ns,
                     boost::optional<std::string> name, boost::optional<std::string> uid,
                     PseudoDt::Up pseudoPktCtxType, PseudoDt::Up pseudoErHeaderType,
                     PseudoDt::Up pseudoErCommonCtxType, const ClockType * const defClkType,
                     MapItem::Up attrs) :
    WithAttrsMixin {std::move(attrs)},
    _id {id},
    _ns {std::move(ns)},
    _name {std::move(name)},
    _uid {std::move(uid)},
    _pseudoPktCtxType {std::move(pseudoPktCtxType)},
    _pseudoErHeaderType {std::move(pseudoErHeaderType)},
    _pseudoErCommonCtxType {std::move(pseudoErCommonCtxType)},
    _defClkType {defClkType}
{
}